

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

fdb_status btreeblk_end(btreeblk_handle *handle)

{
  fdb_status fVar1;
  list_elem *plVar2;
  long in_RDI;
  fdb_status status;
  btreeblk_block *block;
  list_elem *e;
  list_elem *local_18;
  
  fVar1 = btreeblk_operation_end(block);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    local_18 = list_begin((list *)(in_RDI + 0x18));
    while (local_18 != (list_elem *)0x0) {
      plVar2 = list_remove((list *)(in_RDI + 0x18),local_18);
      *(undefined1 *)&local_18[-1].prev = 0;
      list_push_front((list *)(in_RDI + 0x28),local_18);
      local_18 = plVar2;
    }
  }
  return fVar1;
}

Assistant:

fdb_status btreeblk_end(struct btreeblk_handle *handle)
{
    struct list_elem *e;
    struct btreeblk_block *block;
    fdb_status status = FDB_RESULT_SUCCESS;

    // flush all dirty items
    status = btreeblk_operation_end((void *)handle);
    if (status != FDB_RESULT_SUCCESS) {
        return status;
    }

    // remove all items in lists
    e = list_begin(&handle->alc_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->alc_list, &block->le);

        block->dirty = 0;
        list_push_front(&handle->read_list, &block->le);
    }
    return status;
}